

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 *this;
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  char *buffer_00;
  reference pvVar6;
  undefined1 local_80 [8];
  vector<char,_std::allocator<char>_> buffer;
  Chunk local_60;
  Chunk local_58;
  undefined1 local_50 [8];
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  array<char,_4UL> local_24;
  Chunk local_20;
  Chunk ch;
  char **argv_local;
  int argc_local;
  
  ch.pimpl = (impl *)argv;
  riffcpp::Chunk::Chunk(&local_20,"minimal.riff");
  local_24._M_elems = (_Type)riffcpp::Chunk::id(&local_20);
  bVar1 = std::operator==(&local_24,(array<char,_4UL> *)&riffcpp::riff_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
    poVar3 = std::operator<<(poVar3,": ch.id() == riffcpp::riff_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
  std::operator<<(poVar3,"): OK\n");
  chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = riffcpp::Chunk::type(&local_20);
  bVar1 = std::operator==((array<char,_4UL> *)
                          &chunks.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&smpl_id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
    poVar3 = std::operator<<(poVar3,": ch.type() == smpl_id\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Expected \'smpl\' chunk");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
  std::operator<<(poVar3,"): OK\n");
  riffcpp::Chunk::begin(&local_58,SUB81(&local_20,0));
  riffcpp::Chunk::end(&local_60);
  this = &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17;
  std::allocator<riffcpp::Chunk>::allocator((allocator<riffcpp::Chunk> *)this);
  std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::vector<riffcpp::Chunk::iterator,void>
            ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)local_50,(iterator *)&local_58
             ,(iterator *)&local_60,(allocator_type *)this);
  std::allocator<riffcpp::Chunk>::~allocator
            ((allocator<riffcpp::Chunk> *)
             &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_60);
  riffcpp::Chunk::iterator::~iterator((iterator *)&local_58);
  sVar4 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::size
                    ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_50);
  if (sVar4 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
    poVar3 = std::operator<<(poVar3,": chunks.size() == 1\n");
    poVar3 = std::operator<<(poVar3,"Reason: ");
    poVar3 = std::operator<<(poVar3,"Toplevel chunk must contain one subchunk");
    std::operator<<(poVar3,'\n');
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"chunks.size() == 1 (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,8);
  std::operator<<(poVar3,"): OK\n");
  pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                     ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_50,0);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._19_4_ = riffcpp::Chunk::id(pvVar5)
  ;
  bVar1 = std::operator==((array<char,_4UL> *)
                          &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x13
                          ,&test_id);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == test_id (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,9);
    std::operator<<(poVar3,"): OK\n");
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_80);
    pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                       ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_50,0);
    uVar2 = riffcpp::Chunk::size(pvVar5);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_80,(ulong)uVar2);
    pvVar5 = std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::operator[]
                       ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_50,0);
    buffer_00 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)local_80);
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_80);
    riffcpp::Chunk::read_data(pvVar5,buffer_00,sVar4);
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_80);
    if (sVar4 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd);
      poVar3 = std::operator<<(poVar3,": buffer.size() == 1\n");
      poVar3 = std::operator<<(poVar3,"Reason: ");
      poVar3 = std::operator<<(poVar3,"Subchunk must have data size 1");
      std::operator<<(poVar3,'\n');
      exit(1);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"buffer.size() == 1 (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd);
    std::operator<<(poVar3,"): OK\n");
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_80,0);
    if (*pvVar6 != -1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe);
      poVar3 = std::operator<<(poVar3,": (unsigned char)buffer[0] == 0xFF\n");
      poVar3 = std::operator<<(poVar3,"Reason: ");
      poVar3 = std::operator<<(poVar3,"Subchunk must contain \'0xFF\'");
      std::operator<<(poVar3,'\n');
      exit(1);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"(unsigned char)buffer[0] == 0xFF (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe);
    std::operator<<(poVar3,"): OK\n");
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_80);
    std::vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::~vector
              ((vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> *)local_50);
    riffcpp::Chunk::~Chunk(&local_20);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,9);
  poVar3 = std::operator<<(poVar3,": chunks[0].id() == test_id\n");
  poVar3 = std::operator<<(poVar3,"Reason: ");
  poVar3 = std::operator<<(poVar3,"Subchunk must have \'test\' id");
  std::operator<<(poVar3,'\n');
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  riffcpp::Chunk ch("minimal.riff");
  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks(ch.begin(), ch.end());
  TEST_ASSERT(chunks.size() == 1, "Toplevel chunk must contain one subchunk");
  TEST_ASSERT(chunks[0].id() == test_id, "Subchunk must have 'test' id");
  std::vector<char> buffer;
  buffer.resize(chunks[0].size());
  chunks[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(buffer.size() == 1, "Subchunk must have data size 1");
  TEST_ASSERT((unsigned char)buffer[0] == 0xFF, "Subchunk must contain '0xFF'");
}